

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMem.c
# Opt level: O1

void Fraig_MemFixedStop(Fraig_MemFixed_t *p,int fVerbose)

{
  long lVar1;
  
  if (p != (Fraig_MemFixed_t *)0x0) {
    if (fVerbose != 0) {
      printf("Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
             (ulong)(uint)p->nEntrySize,(ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nEntriesMax,
             (ulong)(uint)(p->nEntrySize * p->nEntriesUsed),(ulong)(uint)p->nMemoryAlloc);
    }
    if (0 < p->nChunks) {
      lVar1 = 0;
      do {
        if (p->pChunks[lVar1] != (char *)0x0) {
          free(p->pChunks[lVar1]);
          p->pChunks[lVar1] = (char *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nChunks);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Fraig_MemFixedStop( Fraig_MemFixed_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
            p->nEntrySize, p->nChunkSize, p->nChunks );
        printf( "   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
            p->nEntriesUsed, p->nEntriesMax, p->nEntrySize * p->nEntriesUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}